

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# array_functions.cpp
# Opt level: O0

void duckdb::ArrayGenericFold<float,duckdb::InnerProductOp>
               (DataChunk *args,ExpressionState *state,Vector *result)

{
  bool bVar1;
  reference pvVar2;
  string *fmt_str;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *params;
  LogicalType *pLVar3;
  InvalidInputException *pIVar4;
  Vector *in_RDX;
  DataChunk *in_RDI;
  float *rhs_data_ptr;
  float *lhs_data_ptr;
  idx_t right_offset;
  idx_t left_offset;
  idx_t rhs_idx;
  idx_t lhs_idx;
  idx_t i;
  idx_t array_size;
  float *res_data;
  float *rhs_data;
  float *lhs_data;
  UnifiedVectorFormat rhs_format;
  UnifiedVectorFormat lhs_format;
  ValidityMask *rhs_child_validity;
  ValidityMask *lhs_child_validity;
  Vector *rhs_child;
  Vector *lhs_child;
  idx_t count;
  string *func_name;
  BoundFunctionExpression *expr;
  ExecuteFunctionState *lstate;
  size_type in_stack_fffffffffffffd58;
  undefined4 in_stack_fffffffffffffd60;
  float in_stack_fffffffffffffd64;
  TemplatedValidityMask<unsigned_long> *in_stack_fffffffffffffd68;
  idx_t in_stack_fffffffffffffd70;
  allocator *paVar5;
  undefined7 in_stack_fffffffffffffd78;
  undefined1 in_stack_fffffffffffffd7f;
  BaseExpression *in_stack_fffffffffffffda0;
  string local_218 [39];
  allocator local_1f1;
  string local_1f0 [32];
  string local_1d0 [32];
  long local_1b0;
  undefined1 local_1a1;
  string local_1a0 [39];
  allocator local_179;
  string local_178 [32];
  string local_158 [32];
  long local_138;
  idx_t local_130;
  idx_t local_128;
  UnifiedVectorFormat *local_120;
  idx_t local_118;
  float *local_110;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_108;
  string *local_100;
  SelectionVector *local_e8 [9];
  SelectionVector *local_a0 [9];
  ValidityMask *local_58;
  ValidityMask *local_50;
  undefined8 local_48;
  undefined8 local_40;
  UnifiedVectorFormat *local_38;
  BoundFunctionExpression *local_30;
  BoundFunctionExpression *local_28;
  ExecuteFunctionState *local_20;
  Vector *local_18;
  DataChunk *local_8;
  
  local_18 = in_RDX;
  local_8 = in_RDI;
  local_20 = ExpressionState::Cast<duckdb::ExecuteFunctionState>
                       ((ExpressionState *)
                        CONCAT44(in_stack_fffffffffffffd64,in_stack_fffffffffffffd60));
  local_28 = BaseExpression::Cast<duckdb::BoundFunctionExpression>(in_stack_fffffffffffffda0);
  local_30 = local_28 + 0x60;
  local_38 = (UnifiedVectorFormat *)DataChunk::size(local_8);
  pvVar2 = vector<duckdb::Vector,_true>::operator[]
                     ((vector<duckdb::Vector,_true> *)
                      CONCAT44(in_stack_fffffffffffffd64,in_stack_fffffffffffffd60),
                      in_stack_fffffffffffffd58);
  local_40 = duckdb::ArrayVector::GetEntry(pvVar2);
  pvVar2 = vector<duckdb::Vector,_true>::operator[]
                     ((vector<duckdb::Vector,_true> *)
                      CONCAT44(in_stack_fffffffffffffd64,in_stack_fffffffffffffd60),
                      in_stack_fffffffffffffd58);
  local_48 = duckdb::ArrayVector::GetEntry(pvVar2);
  local_50 = FlatVector::Validity((Vector *)0xbc95b6);
  local_58 = FlatVector::Validity((Vector *)0xbc95cb);
  duckdb::UnifiedVectorFormat::UnifiedVectorFormat((UnifiedVectorFormat *)local_a0);
  duckdb::UnifiedVectorFormat::UnifiedVectorFormat((UnifiedVectorFormat *)local_e8);
  pvVar2 = vector<duckdb::Vector,_true>::operator[]
                     ((vector<duckdb::Vector,_true> *)
                      CONCAT44(in_stack_fffffffffffffd64,in_stack_fffffffffffffd60),
                      in_stack_fffffffffffffd58);
  duckdb::Vector::ToUnifiedFormat((ulong)pvVar2,local_38);
  pvVar2 = vector<duckdb::Vector,_true>::operator[]
                     ((vector<duckdb::Vector,_true> *)
                      CONCAT44(in_stack_fffffffffffffd64,in_stack_fffffffffffffd60),
                      in_stack_fffffffffffffd58);
  duckdb::Vector::ToUnifiedFormat((ulong)pvVar2,local_38);
  fmt_str = (string *)FlatVector::GetData<float>((Vector *)0xbc9665);
  local_100 = fmt_str;
  params = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
           FlatVector::GetData<float>((Vector *)0xbc9686);
  local_108 = params;
  local_110 = FlatVector::GetData<float>((Vector *)0xbc96a7);
  pvVar2 = vector<duckdb::Vector,_true>::operator[]
                     ((vector<duckdb::Vector,_true> *)
                      CONCAT44(in_stack_fffffffffffffd64,in_stack_fffffffffffffd60),
                      in_stack_fffffffffffffd58);
  pLVar3 = Vector::GetType(pvVar2);
  local_118 = duckdb::ArrayType::GetSize(pLVar3);
  local_120 = (UnifiedVectorFormat *)0x0;
  do {
    if (local_38 <= local_120) {
      if (local_38 == (UnifiedVectorFormat *)0x1) {
        duckdb::Vector::SetVectorType((VectorType)local_18);
      }
      UnifiedVectorFormat::~UnifiedVectorFormat
                ((UnifiedVectorFormat *)
                 CONCAT44(in_stack_fffffffffffffd64,in_stack_fffffffffffffd60));
      UnifiedVectorFormat::~UnifiedVectorFormat
                ((UnifiedVectorFormat *)
                 CONCAT44(in_stack_fffffffffffffd64,in_stack_fffffffffffffd60));
      return;
    }
    local_128 = SelectionVector::get_index(local_a0[0],(idx_t)local_120);
    local_130 = SelectionVector::get_index(local_e8[0],(idx_t)local_120);
    bVar1 = TemplatedValidityMask<unsigned_long>::RowIsValid
                      (in_stack_fffffffffffffd68,
                       CONCAT44(in_stack_fffffffffffffd64,in_stack_fffffffffffffd60));
    if ((bVar1) &&
       (bVar1 = TemplatedValidityMask<unsigned_long>::RowIsValid
                          (in_stack_fffffffffffffd68,
                           CONCAT44(in_stack_fffffffffffffd64,in_stack_fffffffffffffd60)), bVar1)) {
      local_138 = local_128 * local_118;
      bVar1 = TemplatedValidityMask<unsigned_long>::CheckAllValid
                        ((TemplatedValidityMask<unsigned_long> *)
                         CONCAT17(in_stack_fffffffffffffd7f,in_stack_fffffffffffffd78),
                         in_stack_fffffffffffffd70,(idx_t)in_stack_fffffffffffffd68);
      if (!bVar1) {
        local_1a1 = 1;
        pIVar4 = (InvalidInputException *)__cxa_allocate_exception(0x10);
        std::allocator<char>::allocator();
        std::__cxx11::string::string
                  (local_178,"%s: left argument can not contain NULL values",&local_179);
        std::__cxx11::string::string(local_1a0,(string *)local_30);
        StringUtil::Format<std::__cxx11::string>(fmt_str,params);
        duckdb::InvalidInputException::InvalidInputException(pIVar4,local_158);
        local_1a1 = 0;
        __cxa_throw(pIVar4,&InvalidInputException::typeinfo,
                    InvalidInputException::~InvalidInputException);
      }
      local_1b0 = local_130 * local_118;
      in_stack_fffffffffffffd7f =
           TemplatedValidityMask<unsigned_long>::CheckAllValid
                     ((TemplatedValidityMask<unsigned_long> *)
                      CONCAT17(in_stack_fffffffffffffd7f,in_stack_fffffffffffffd78),
                      in_stack_fffffffffffffd70,(idx_t)in_stack_fffffffffffffd68);
      if (!(bool)in_stack_fffffffffffffd7f) {
        pIVar4 = (InvalidInputException *)__cxa_allocate_exception(0x10);
        paVar5 = &local_1f1;
        std::allocator<char>::allocator();
        std::__cxx11::string::string
                  (local_1f0,"%s: right argument can not contain NULL values",paVar5);
        std::__cxx11::string::string(local_218,(string *)local_30);
        StringUtil::Format<std::__cxx11::string>(fmt_str,params);
        duckdb::InvalidInputException::InvalidInputException(pIVar4,local_1d0);
        __cxa_throw(pIVar4,&InvalidInputException::typeinfo,
                    InvalidInputException::~InvalidInputException);
      }
      in_stack_fffffffffffffd64 =
           InnerProductOp::Operation<float>
                     ((float *)(&local_100->_M_dataplus + local_138 * 4),
                      (float *)(&local_108->_M_dataplus + local_1b0 * 4),local_118);
      local_110[(long)local_120] = in_stack_fffffffffffffd64;
    }
    else {
      duckdb::FlatVector::SetNull(local_18,(ulong)local_120,true);
    }
    local_120 = local_120 + 1;
  } while( true );
}

Assistant:

static void ArrayGenericFold(DataChunk &args, ExpressionState &state, Vector &result) {
	const auto &lstate = state.Cast<ExecuteFunctionState>();
	const auto &expr = lstate.expr.Cast<BoundFunctionExpression>();
	const auto &func_name = expr.function.name;

	const auto count = args.size();
	auto &lhs_child = ArrayVector::GetEntry(args.data[0]);
	auto &rhs_child = ArrayVector::GetEntry(args.data[1]);

	const auto &lhs_child_validity = FlatVector::Validity(lhs_child);
	const auto &rhs_child_validity = FlatVector::Validity(rhs_child);

	UnifiedVectorFormat lhs_format;
	UnifiedVectorFormat rhs_format;

	args.data[0].ToUnifiedFormat(count, lhs_format);
	args.data[1].ToUnifiedFormat(count, rhs_format);

	auto lhs_data = FlatVector::GetData<TYPE>(lhs_child);
	auto rhs_data = FlatVector::GetData<TYPE>(rhs_child);
	auto res_data = FlatVector::GetData<TYPE>(result);

	const auto array_size = ArrayType::GetSize(args.data[0].GetType());
	D_ASSERT(array_size == ArrayType::GetSize(args.data[1].GetType()));

	for (idx_t i = 0; i < count; i++) {
		const auto lhs_idx = lhs_format.sel->get_index(i);
		const auto rhs_idx = rhs_format.sel->get_index(i);

		if (!lhs_format.validity.RowIsValid(lhs_idx) || !rhs_format.validity.RowIsValid(rhs_idx)) {
			FlatVector::SetNull(result, i, true);
			continue;
		}

		const auto left_offset = lhs_idx * array_size;
		if (!lhs_child_validity.CheckAllValid(left_offset + array_size, left_offset)) {
			throw InvalidInputException(StringUtil::Format("%s: left argument can not contain NULL values", func_name));
		}

		const auto right_offset = rhs_idx * array_size;
		if (!rhs_child_validity.CheckAllValid(right_offset + array_size, right_offset)) {
			throw InvalidInputException(
			    StringUtil::Format("%s: right argument can not contain NULL values", func_name));
		}

		const auto lhs_data_ptr = lhs_data + left_offset;
		const auto rhs_data_ptr = rhs_data + right_offset;

		res_data[i] = OP::Operation(lhs_data_ptr, rhs_data_ptr, array_size);
	}

	if (count == 1) {
		result.SetVectorType(VectorType::CONSTANT_VECTOR);
	}
}